

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_fold.c
# Opt level: O0

void printhash(BuildCtx *ctx,uint32_t *htab,uint32_t sz)

{
  int in_EDX;
  uint *in_RSI;
  long in_RDI;
  uint32_t i;
  uint local_18;
  
  fprintf(*(FILE **)(in_RDI + 0x10),"static const uint32_t fold_hash[%d] = {\n0x%08x",
          (ulong)(in_EDX + 1),(ulong)*in_RSI);
  for (local_18 = 1; local_18 < in_EDX + 1U; local_18 = local_18 + 1) {
    fprintf(*(FILE **)(in_RDI + 0x10),",\n0x%08x",(ulong)in_RSI[local_18]);
  }
  fprintf(*(FILE **)(in_RDI + 0x10),"\n};\n\n");
  return;
}

Assistant:

static void printhash(BuildCtx *ctx, uint32_t *htab, uint32_t sz)
{
  uint32_t i;
  fprintf(ctx->fp, "static const uint32_t fold_hash[%d] = {\n0x%08x",
	  sz+1, htab[0]);
  for (i = 1; i < sz+1; i++)
    fprintf(ctx->fp, ",\n0x%08x", htab[i]);
  fprintf(ctx->fp, "\n};\n\n");
}